

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::parsing::system::parser_t::value_type::emplace<std::__cxx11::string,std::__cxx11::string>
          (value_type *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&std::__cxx11::string::typeinfo;
    std::__cxx11::string::string((string *)this,(string *)u);
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O2/src/parsing/system_parser/system.tab.hh"
                ,0x110,
                "T &tchecker::parsing::system::parser_t::value_type::emplace(U &&...) [T = std::basic_string<char>, U = <std::basic_string<char>>]"
               );
}

Assistant:

T&
    emplace (U&&... u)
    {
      SPYY_ASSERT (!yytypeid_);
      SPYY_ASSERT (sizeof (T) <= size);
      yytypeid_ = & typeid (T);
      return *new (yyas_<T> ()) T (std::forward <U>(u)...);
    }